

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collective.hpp
# Opt level: O0

vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> * __thiscall
mxx::gatherv<std::pair<int,int>>
          (vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
           *__return_storage_ptr__,mxx *this,pair<int,_int> *data,size_t size,int root,comm *comm)

{
  undefined4 in_register_00000084;
  comm *in_stack_ffffffffffffff88;
  undefined1 local_48 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> recv_sizes;
  comm *comm_local;
  pair<int,_int> *ppStack_20;
  int root_local;
  size_t size_local;
  pair<int,_int> *data_local;
  
  recv_sizes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)CONCAT44(in_register_00000084,root);
  ppStack_20 = data;
  size_local = (size_t)this;
  data_local = (pair<int,_int> *)__return_storage_ptr__;
  gather<unsigned_long>
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_48,
             (unsigned_long *)&stack0xffffffffffffffe0,(int)size,
             (comm *)recv_sizes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage);
  gatherv<std::pair<int,int>>
            (__return_storage_ptr__,(mxx *)size_local,ppStack_20,(size_t)local_48,
             (vector<unsigned_long,_std::allocator<unsigned_long>_> *)(size & 0xffffffff),
             (int)recv_sizes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage,in_stack_ffffffffffffff88);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_48);
  return __return_storage_ptr__;
}

Assistant:

std::vector<T> gatherv(const T* data, size_t size, int root, const mxx::comm& comm = mxx::comm()) {
    // recv_sizes is unknown -> first collect via gather
    std::vector<size_t> recv_sizes = gather(size, root, comm);
    return gatherv(data, size, recv_sizes, root, comm);
}